

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall google::protobuf::internal::ExtensionSet::Erase(ExtensionSet *this,int key)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  size_t __n;
  int local_14;
  
  local_14 = key;
  if ((short)this->flat_size_ < 0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
    ::erase((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
             *)(this->map_).flat,&local_14);
  }
  else {
    pKVar1 = flat_end(this);
    pKVar2 = flat_begin(this);
    pKVar2 = std::
             __lower_bound<google::protobuf::internal::ExtensionSet::KeyValue*,int,__gnu_cxx::__ops::_Iter_comp_val<google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>>
                       (pKVar2,pKVar1,&local_14);
    if ((pKVar2 != pKVar1) && (pKVar2->first == local_14)) {
      __n = (long)pKVar1 - (long)(pKVar2 + 1);
      if (__n != 0) {
        memmove(pKVar2,pKVar2 + 1,__n);
      }
      this->flat_size_ = this->flat_size_ - 1;
    }
  }
  return;
}

Assistant:

void ExtensionSet::Erase(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    map_.large->erase(key);
    return;
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    std::copy(it + 1, end, it);
    --flat_size_;
  }
}